

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceDynamicProfileManager.cpp
# Opt level: O3

void __thiscall
Js::SourceDynamicProfileManager::SaveToDynamicProfileStorage
          (SourceDynamicProfileManager *this,char16 *url)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  char *buffer;
  undefined1 local_38 [8];
  BufferWriter writer;
  BufferSizeCounter counter;
  
  if (!DynamicProfileStorage::enabled) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceDynamicProfileManager.cpp"
                                ,0x1aa,"(DynamicProfileStorage::IsEnabled())",
                                "DynamicProfileStorage::IsEnabled()");
    if (!bVar2) goto LAB_00b00037;
    *puVar3 = 0;
  }
  writer.lengthLeft = 0;
  bVar2 = Serialize<Js::BufferSizeCounter>(this,(BufferSizeCounter *)&writer.lengthLeft);
  if ((bVar2) && (writer.lengthLeft >> 0x20 == 0)) {
    buffer = DynamicProfileStorage::AllocRecord((DWORD)writer.lengthLeft);
    bVar2 = Phases::IsEnabled((Phases *)&DAT_015b3868,DynamicProfilePhase);
    if (bVar2) {
      Output::Print(L"%-180s : %d bytes\n",url,writer.lengthLeft);
    }
    local_38 = (undefined1  [8])DynamicProfileStorage::GetRecordBuffer(buffer);
    writer.current = (char *)writer.lengthLeft;
    bVar2 = Serialize<Js::BufferWriter>(this,(BufferWriter *)local_38);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceDynamicProfileManager.cpp"
                                  ,0x1c2,"(false)","false");
      if (!bVar2) {
LAB_00b00037:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
      DynamicProfileStorage::DeleteRecord(buffer);
    }
    DynamicProfileStorage::SaveRecord(url,buffer);
  }
  return;
}

Assistant:

void
    SourceDynamicProfileManager::SaveToDynamicProfileStorage(char16 const * url)
    {
        Assert(DynamicProfileStorage::IsEnabled());
        BufferSizeCounter counter;
        if (!this->Serialize(&counter))
        {
            return;
        }

        if (counter.GetByteCount() > UINT_MAX)
        {
            // too big
            return;
        }

        char * record = DynamicProfileStorage::AllocRecord(static_cast<DWORD>(counter.GetByteCount()));
#if DBG_DUMP
        if (PHASE_STATS1(DynamicProfilePhase))
        {
            Output::Print(_u("%-180s : %d bytes\n"), url, counter.GetByteCount());
        }
#endif

        BufferWriter writer(DynamicProfileStorage::GetRecordBuffer(record), counter.GetByteCount());
        if (!this->Serialize(&writer))
        {
            Assert(false);
            DynamicProfileStorage::DeleteRecord(record);
        }

        DynamicProfileStorage::SaveRecord(url, record);
    }